

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O0

void rsg::(anonymous_namespace)::computeEqualityValueRange<false,int>
               (Random *rnd,bool dstMin,bool dstMax,int *aMin,int *aMax,int *bMin,int *bMax)

{
  int iVar1;
  GetRandom local_39 [7];
  ComputeLessThanRange local_32;
  ComputeLessThanRange local_31;
  int val;
  int *bMin_local;
  int *aMax_local;
  int *aMin_local;
  bool dstMax_local;
  Random *pRStack_10;
  bool dstMin_local;
  Random *rnd_local;
  
  _val = bMin;
  bMin_local = aMax;
  aMax_local = aMin;
  aMin_local._6_1_ = dstMax;
  aMin_local._7_1_ = dstMin;
  pRStack_10 = rnd;
  if ((dstMin) || (!dstMax)) {
    if (dstMin) {
      ComputeLessThanRange::operator()(&local_32,rnd,true,true,aMin,aMax,bMin,bMax);
    }
    else {
      iVar1 = anon_unknown_71::computeEqualityValueRange<false,_int>::GetRandom::operator()
                        (local_39,rnd,-1,1);
      *aMax_local = iVar1;
      *bMin_local = iVar1;
      *_val = iVar1;
      *bMax = iVar1;
    }
  }
  else {
    ComputeLessThanRange::operator()(&local_31,rnd,false,true,aMin,aMax,bMin,bMax);
  }
  return;
}

Assistant:

void computeEqualityValueRange (de::Random& rnd, bool dstMin, bool dstMax, T& aMin, T& aMax, T& bMin, T& bMax)
{
	if (dstMin == false && dstMax == true)
		ComputeLessThanRange()(rnd, false, true, aMin, aMax, bMin, bMax);
	else if (IsEqual && dstMin == false)
		ComputeLessThanRange()(rnd, true, true, aMin, aMax, bMin, bMax);
	else if (!IsEqual && dstMin == true)
		ComputeLessThanRange()(rnd, true, true, aMin, aMax, bMin, bMax);
	else
	{
		// Must have exactly same values.
		struct GetRandom
		{
			int		operator() (de::Random& random, int min, int max) const		{ return random.getInt(min, max); }
			float	operator() (de::Random& random, float min, float max) const	{ return getQuantizedFloat(random, min, max, 0.5f); }
		};

		T val = GetRandom()(rnd, T(-1), T(1));

		aMin	= val;
		aMax	= val;
		bMin	= val;
		bMax	= val;
	}
}